

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.c
# Opt level: O1

Value * evaluate_prefix_expression(Scope *scope,PrefixExpression *prefix_expression)

{
  Operator OVar1;
  Value *right_value;
  Value *pVVar2;
  
  right_value = evaluate_expression(scope,prefix_expression->right_expression);
  OVar1 = prefix_expression->operator;
  if (OVar1 == ADDITION_OP) {
    pVVar2 = apply_prefix_plus_operation(right_value);
  }
  else if (OVar1 == SUBTRACTION_OP) {
    pVVar2 = apply_prefix_minus_operation(right_value);
  }
  else if (OVar1 == NOT_OP) {
    pVVar2 = apply_prefix_not_operation(right_value);
  }
  else {
    pVVar2 = new_null_value();
  }
  free_value(right_value);
  return pVVar2;
}

Assistant:

Value *evaluate_prefix_expression(Scope *scope, PrefixExpression *prefix_expression) {
  Value *result_value;

  Value *right_value = evaluate_expression(scope, prefix_expression->right_expression);

  switch (prefix_expression->operator) {
    case NOT_OP: {
      result_value = apply_prefix_not_operation(right_value);
      break;
    }

    case ADDITION_OP: {
      result_value = apply_prefix_plus_operation(right_value);
      break;
    }

    case SUBTRACTION_OP: {
      result_value = apply_prefix_minus_operation(right_value);
      break;
    }

    default: {
      result_value = new_null_value();
      break;
    }
  }

  free_value(right_value);

  return result_value;
}